

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_test.cc
# Opt level: O0

void __thiscall
xLearn::MAEMetricTest_mae_test_Test::MAEMetricTest_mae_test_Test(MAEMetricTest_mae_test_Test *this)

{
  Test *in_RDI;
  
  testing::Test::Test(in_RDI);
  in_RDI->_vptr_Test = (_func_int **)&PTR__MAEMetricTest_mae_test_Test_001fe5f8;
  return;
}

Assistant:

TEST(MAEMetricTest, mae_test) {
  std::vector<real_t> Y;
  Y.push_back(12);
  Y.push_back(13);
  Y.push_back(14);
  Y.push_back(15);
  std::vector<real_t> pred;
  pred.push_back(11);
  pred.push_back(12);
  pred.push_back(13);
  pred.push_back(14);
  MAEMetric metric;
  size_t threadNumber = std::thread::hardware_concurrency();
  ThreadPool* pool = new ThreadPool(threadNumber);
  metric.Initialize(pool);
  metric.Accumulate(Y, pred);
  real_t metric_val = metric.GetMetric();
  EXPECT_FLOAT_EQ(metric_val, 1.0);
  metric.Reset();
  Y[0] = 23;
  Y[1] = 24;
  Y[2] = 25;
  Y[3] = 26;
  pred[0] = 12;
  pred[1] = 12;
  pred[2] = 12;
  pred[3] = 12;
  metric.Accumulate(Y, pred);
  metric_val = metric.GetMetric();
  EXPECT_FLOAT_EQ(metric_val, 12.5);
  EXPECT_EQ(metric.metric_type(), "MAE");
}